

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::TcParser::MpVerifyUtf8
          (TcParser *this,string_view wire_bytes,TcParseTableBase *table,FieldEntry *entry,
          uint16_t xform_val)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  TcParseTableBase *table_00;
  undefined1 unaff_BL;
  bool bVar5;
  string_view message_name;
  string_view sVar6;
  string_view field_name;
  
  table_00 = (TcParseTableBase *)wire_bytes._M_str;
  if ((int)entry == 0x200) {
    iVar4 = utf8_range_IsValid((char *)wire_bytes._M_len,(size_t)this);
    bVar5 = true;
    if (iVar4 != 0) {
      return true;
    }
  }
  else {
    if ((int)entry != 0x400) {
      return true;
    }
    iVar4 = utf8_range_IsValid((char *)wire_bytes._M_len,(size_t)this);
    if (iVar4 != 0) {
      return true;
    }
    bVar5 = false;
  }
  pcVar1 = (char *)((long)&table_00->has_bits_offset +
                   (ulong)table_00->num_aux_entries * 8 + (ulong)table_00->aux_offset);
  uVar3 = table_00->num_field_entries;
  cVar2 = *pcVar1;
  sVar6 = FieldName(table_00,(FieldEntry *)table);
  message_name._M_str = (char *)sVar6._M_len;
  message_name._M_len = (size_t)(pcVar1 + (uVar3 + 8 & 0xfffffff8));
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)sVar6._M_str;
  PrintUTF8ErrorLog((internal *)(long)cVar2,message_name,field_name,(char *)0x0,(bool)unaff_BL);
  return bVar5;
}

Assistant:

bool TcParser::MpVerifyUtf8(absl::string_view wire_bytes,
                            const TcParseTableBase* table,
                            const FieldEntry& entry, uint16_t xform_val) {
  if (xform_val == field_layout::kTvUtf8) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
      return false;
    }
    return true;
  }
#ifndef NDEBUG
  if (xform_val == field_layout::kTvUtf8Debug) {
    if (!utf8_range::IsStructurallyValid(wire_bytes)) {
      PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry), "parsing",
                        false);
    }
  }
#endif  // NDEBUG
  return true;
}